

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_validateSequence
                 (U32 offCode,U32 matchLength,size_t posInSrc,U32 windowLog,size_t dictSize,
                 U32 minMatch)

{
  uint uVar1;
  undefined8 local_50;
  U32 windowSize;
  size_t offsetBound;
  U32 minMatch_local;
  size_t dictSize_local;
  U32 windowLog_local;
  size_t posInSrc_local;
  U32 matchLength_local;
  U32 offCode_local;
  
  uVar1 = 1 << ((byte)windowLog & 0x1f);
  if (uVar1 < posInSrc) {
    local_50 = (ulong)uVar1;
  }
  else {
    local_50 = posInSrc + dictSize;
  }
  if (local_50 + 2 < (ulong)offCode) {
    _matchLength_local = 0xffffffffffffffec;
  }
  else if (matchLength < minMatch) {
    _matchLength_local = 0xffffffffffffffec;
  }
  else {
    _matchLength_local = 0;
  }
  return _matchLength_local;
}

Assistant:

static size_t ZSTD_validateSequence(U32 offCode, U32 matchLength,
                                    size_t posInSrc, U32 windowLog, size_t dictSize, U32 minMatch) {
    size_t offsetBound;
    U32 windowSize = 1 << windowLog;
    /* posInSrc represents the amount of data the the decoder would decode up to this point.
     * As long as the amount of data decoded is less than or equal to window size, offsets may be
     * larger than the total length of output decoded in order to reference the dict, even larger than
     * window size. After output surpasses windowSize, we're limited to windowSize offsets again.
     */
    offsetBound = posInSrc > windowSize ? (size_t)windowSize : posInSrc + (size_t)dictSize;
    RETURN_ERROR_IF(offCode > offsetBound + ZSTD_REP_MOVE, corruption_detected, "Offset too large!");
    RETURN_ERROR_IF(matchLength < minMatch, corruption_detected, "Matchlength too small");
    return 0;
}